

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O3

void __thiscall
amrex::MLCellLinOp::applyBC
          (MLCellLinOp *this,int amrlev,int mglev,MultiFab *in,BCMode bc_mode,StateMode param_5,
          MLMGBndry *bndry,bool skip_fillboundary)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  FabSet *pFVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int *piVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int *piVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  Periodicity PVar40;
  IntVect hi;
  IntVect low;
  MFIter mfi;
  FArrayBox foofab;
  long local_450;
  Array4<double> local_448;
  long local_408;
  long local_400;
  int local_3f4;
  int local_3f0;
  BCMode local_3ec;
  long local_3e8;
  int *local_3e0;
  int *local_3d8;
  double *local_3d0;
  long local_3c8;
  int *local_3c0;
  uint local_3b8;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  Array4<const_int> local_3a8;
  Array4<const_int> local_368;
  ulong local_328;
  ulong local_320;
  ulong local_318;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  ulong local_2f8;
  ulong local_2f0;
  double local_2e8 [5];
  double local_2c0 [4];
  long local_2a0;
  long local_298;
  ulong local_290;
  long local_288;
  long local_280;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  ulong local_260;
  ulong local_258;
  Array4<const_double> local_250;
  ulong local_210;
  int *local_208;
  int local_1fc;
  uint local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  Array4<const_double> local_1e8;
  FabArray<amrex::FArrayBox> *local_1a8;
  long local_1a0;
  double local_198;
  double local_190;
  double local_188;
  undefined1 local_180 [20];
  uint local_16c;
  IndexType local_168;
  MFItInfo local_164;
  long local_150;
  ulong local_148;
  long local_140;
  int *local_138;
  long local_130;
  long local_128;
  double *local_120;
  FabSet *local_118;
  long *local_110;
  long *local_108;
  long local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  MFIter local_d8;
  BaseFab<double> local_78;
  
  local_3ec = bc_mode;
  local_3b8 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  iVar16 = (*(this->super_MLLinOp)._vptr_MLLinOp[0x45])(this);
  iVar17 = (*(this->super_MLLinOp)._vptr_MLLinOp[0x46])(this);
  local_3ac = CONCAT31(local_3ac._1_3_,(char)iVar17);
  uVar34 = local_3b8;
  local_1a8 = &in->super_FabArray<amrex::FArrayBox>;
  if (!skip_fillboundary) {
    PVar40 = Geometry::periodicity
                       ((Geometry *)
                        ((long)mglev * 200 +
                        *(long *)&(this->super_MLLinOp).m_geom.
                                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                        ));
    uVar34 = local_3b8;
    local_d8.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = PVar40.period.vect._0_8_;
    local_d8.fabArray._0_4_ = PVar40.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (&in->super_FabArray<amrex::FArrayBox>,0,local_3b8,(Periodicity *)&local_d8,
               SUB41(iVar16,0));
  }
  lVar18 = (long)mglev;
  lVar25 = *(long *)&(this->super_MLLinOp).m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar30 = lVar18 * 200;
  local_188 = *(double *)(lVar25 + 0x38 + lVar30);
  local_190 = *(double *)(lVar25 + 0x40 + lVar30);
  local_198 = *(double *)(lVar25 + 0x48 + lVar30);
  local_100 = lVar18 * 0x900 +
              *(long *)&(this->m_maskvals).
                        super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
  ;
  local_1f8 = (this->super_MLLinOp).maxorder;
  local_150 = *(long *)(*(long *)&(this->m_bcondloc).
                                  super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                       + lVar18 * 8);
  local_d8.tile_size.vect[0] = 0;
  local_d8.tile_size.vect[1] = 0;
  local_d8.tile_size.vect[2] = 0;
  local_d8.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  local_d8.fabArray._0_4_ = 0;
  local_d8.fabArray._4_4_ = 0;
  FArrayBox::FArrayBox((FArrayBox *)&local_78,(Box *)&local_d8,uVar34,true,false,(Arena *)0x0);
  local_120 = local_78.dptr;
  local_1fc = local_78.nvar;
  local_1a0 = (long)local_78.domain.smallend.vect[2];
  local_210 = (ulong)local_78.domain.smallend.vect[1];
  local_164.do_tiling = false;
  local_164.dynamic = true;
  local_164.device_sync = true;
  local_164.num_streams = Gpu::Device::max_gpu_streams;
  local_164.tilesize.vect[0] = 0;
  local_164.tilesize.vect[1] = 0;
  local_164.tilesize.vect[2] = 0;
  if ((byte)(SUB41(iVar16,0) | (byte)local_3ac) == 1) {
    local_f8 = (ulong)(uint)(this->super_MLLinOp).info.hidden_direction;
    MFIter::MFIter(&local_d8,&local_1a8->super_FabArrayBase,&local_164);
    if (local_d8.currentIndex < local_d8.endIndex) {
      local_130 = (long)local_78.domain.bigend.vect[2] + 1;
      local_138 = (int *)(((long)local_78.domain.bigend.vect[0] -
                          (long)local_78.domain.smallend.vect[0]) + 1);
      local_128 = (((long)local_78.domain.bigend.vect[1] + 1) - local_210) * (long)local_138;
      local_140 = (local_130 - local_1a0) * local_128;
      local_210 = local_210 << 0x20 | (ulong)(uint)local_78.domain.smallend.vect[0];
      local_148 = (long)local_78.domain.bigend.vect[0] + 1U & 0xffffffff |
                  (long)local_78.domain.bigend.vect[1] + 1 << 0x20;
      local_118 = (bndry->super_InterpBndryData).super_BndryData.super_BndryRegister.bndry;
      uVar20 = (ulong)local_3b8;
      local_290 = uVar20;
      do {
        BATransformer::operator()
                  ((Box *)local_180,
                   (BATransformer *)(CONCAT44(local_d8.fabArray._4_4_,(int)local_d8.fabArray) + 8),
                   (Box *)((long)((local_d8.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_d8.currentIndex] * 0x1c +
                          **(long **)(CONCAT44(local_d8.fabArray._4_4_,(int)local_d8.fabArray) +
                                     0x50)));
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_448,local_1a8,&local_d8);
        piVar19 = &local_d8.currentIndex;
        if (local_d8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar19 = ((local_d8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_d8.currentIndex;
        }
        local_110 = (long *)(*(long *)(local_150 + 0x200) + (long)*piVar19 * 0x18);
        local_108 = (long *)((long)*piVar19 * 0x18 + *(long *)(local_150 + 0xf0));
        uVar36 = 0;
        do {
          if (uVar36 != local_f8) {
            local_368.jstride._0_4_ = local_180._8_4_;
            local_368.p = (int *)local_180._0_8_;
            local_3a8.jstride._0_4_ = local_16c;
            local_3a8.p = (int *)local_180._12_8_;
            iVar16 = *(int *)((long)&local_368.p + uVar36 * 4) + -1;
            *(int *)((long)&local_368.p + uVar36 * 4) = iVar16;
            *(int *)((long)&local_3a8.p + uVar36 * 4) = iVar16;
            iVar10 = (int)local_368.jstride;
            local_3c8 = (long)(int)local_368.p;
            local_3e8 = (long)local_368.p._4_4_;
            lVar24 = (long)(int)local_368.jstride;
            local_2f0 = (ulong)local_3a8.p & 0xffffffff;
            local_308 = (ulong)local_3a8.p >> 0x20;
            local_320 = (ulong)(uint)local_3a8.jstride;
            local_368.jstride._0_4_ = local_180._8_4_;
            local_368.p = (int *)local_180._0_8_;
            local_3a8.jstride._0_4_ = local_16c;
            local_3a8.p = (int *)local_180._12_8_;
            local_250.p = (double *)(CONCAT44(local_168.itype >> 1,local_168.itype) & 0x100000001);
            local_250.jstride =
                 CONCAT44(local_250.jstride._4_4_,local_168.itype >> 2) & 0xffffffff00000001;
            iVar16 = (~*(uint *)((long)&local_250.p + uVar36 * 4) & 1) +
                     *(int *)((long)&local_3a8.p + uVar36 * 4);
            *(int *)((long)&local_368.p + uVar36 * 4) = iVar16;
            *(int *)((long)&local_3a8.p + uVar36 * 4) = iVar16;
            lVar25 = local_100;
            iVar11 = (int)local_368.jstride;
            local_400 = (long)(int)local_368.p;
            iVar9 = local_368.p._4_4_;
            lVar18 = (long)local_368.p._4_4_;
            lVar30 = (long)(int)local_368.jstride;
            local_2f8 = (ulong)local_3a8.p & 0xffffffff;
            local_310 = (ulong)local_3a8.p >> 0x20;
            iVar16 = *(int *)(local_180 + uVar36 * 4 + 0xc);
            iVar17 = *(int *)(local_180 + uVar36 * 4);
            local_328 = (ulong)(uint)local_3a8.jstride;
            FabArray<amrex::Mask>::array<amrex::Mask,_0>
                      (&local_368,(FabArray<amrex::Mask> *)(local_100 + uVar36 * 0x180),&local_d8);
            FabArray<amrex::Mask>::array<amrex::Mask,_0>
                      (&local_3a8,(FabArray<amrex::Mask> *)(lVar25 + uVar36 * 0x180 + 0x480),
                       &local_d8);
            pFVar15 = local_118;
            local_318 = uVar36;
            if (bndry == (MLMGBndry *)0x0) {
              local_250.p = local_120;
              local_250.jstride = (Long)local_138;
              local_250.kstride = local_128;
              local_250.nstride = local_140;
              local_250.begin.x = (undefined4)local_210;
              local_250.begin.y = local_210._4_4_;
              local_250.begin.z = (int)local_1a0;
              local_250.end.x = (undefined4)local_148;
              local_250.end.y = local_148._4_4_;
              local_250.end.z = (int)local_130;
              local_250.ncomp = local_1fc;
              local_1e8.p = local_120;
              local_1e8.jstride = (Long)local_138;
              local_1e8.kstride = local_128;
              local_1e8.nstride = local_140;
              local_1e8.begin.x = (undefined4)local_210;
              local_1e8.begin.y = local_210._4_4_;
              local_1e8.begin.z = (int)local_1a0;
              local_1e8.end.x = (undefined4)local_148;
              local_1e8.end.y = local_148._4_4_;
              local_1e8.end.z = (int)local_130;
              local_1e8.ncomp = local_1fc;
            }
            else {
              lVar25 = uVar36 + 3;
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_250,(FabArray<amrex::FArrayBox> *)(local_118 + uVar36),&local_d8);
              uVar36 = local_318;
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_1e8,(FabArray<amrex::FArrayBox> *)(pFVar15 + lVar25),&local_d8);
            }
            dVar14 = local_188;
            dVar13 = local_190;
            dVar12 = local_198;
            dVar7 = 1.0;
            dVar8 = 1.0;
            if (0 < (int)local_3b8) {
              local_e0 = *local_108;
              local_e8 = *local_110;
              uVar34 = (iVar16 - iVar17) + 2;
              if ((int)local_1f8 < (int)uVar34) {
                uVar34 = local_1f8;
              }
              uVar35 = (ulong)uVar34;
              iVar16 = (int)local_3e8;
              local_268 = iVar16 + 1;
              iVar17 = (int)local_3c8;
              local_26c = iVar17 + 1;
              local_270 = iVar10 + 1;
              iVar2 = (int)local_2f0;
              local_3ac = iVar2 + 1;
              iVar3 = (int)local_320;
              local_3f0 = iVar3 + 1;
              iVar4 = (int)local_2f8;
              iVar22 = (int)local_328;
              local_3f4 = iVar22 + 1;
              iVar5 = (int)local_308;
              local_3b0 = iVar5 + 1;
              iVar6 = (int)local_310;
              local_3b4 = iVar6 + 1;
              local_258 = (ulong)(uint)(local_3ac - iVar17);
              local_264 = iVar4 + 1;
              iVar23 = (int)local_400;
              local_260 = (ulong)(uint)((iVar4 + 1) - iVar23);
              local_274 = local_3b0 - iVar16;
              local_278 = local_3b4 - iVar9;
              local_280 = local_3c8 * 8;
              local_298 = local_3c8 * 4;
              local_1ec = iVar9 + -1;
              local_288 = local_400 * 8;
              local_2a0 = local_400 * 4;
              local_1f0 = iVar23 + -1;
              local_1f4 = iVar11 + -1;
              local_408 = 0;
              uVar21 = 0;
              do {
                local_300 = uVar21;
                lVar25 = local_e0 + uVar21 * 0x18;
                iVar33 = *(int *)(lVar25 + uVar36 * 4);
                iVar1 = *(int *)(lVar25 + 0xc + uVar36 * 4);
                lVar25 = uVar21 * 0x30 + local_e8;
                dVar37 = *(double *)(lVar25 + uVar36 * 8);
                dVar38 = *(double *)(lVar25 + 0x18 + uVar36 * 8);
                local_3c0 = (int *)CONCAT44(local_3c0._4_4_,iVar1);
                iVar32 = (int)local_258;
                if ((int)uVar36 == 1) {
                  if (iVar33 == 0x65) {
                    local_2c0[0] = -dVar37 * dVar13;
                    local_2c0[1] = 0.5;
                    local_2c0[2] = 1.5;
                    local_2c0[3] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar34) {
                      uVar20 = 0;
                      do {
                        uVar36 = 0;
                        dVar37 = dVar7;
                        dVar39 = dVar8;
                        do {
                          if (uVar20 != uVar36) {
                            dVar37 = dVar37 * (-0.5 - local_2c0[uVar36]);
                            dVar39 = dVar39 * (local_2c0[uVar20] - local_2c0[uVar36]);
                          }
                          uVar36 = uVar36 + 1;
                        } while (uVar35 != uVar36);
                        local_2e8[uVar20] = dVar37 / dVar39;
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != uVar35);
                    }
                    uVar20 = local_290;
                    uVar36 = local_318;
                    if (iVar10 <= iVar3) {
                      local_3d8 = (int *)(long)local_368.begin.z;
                      local_3e0 = (int *)local_368.kstride;
                      lVar25 = lVar24;
                      do {
                        if (iVar17 <= iVar2) {
                          local_3d0 = local_448.p +
                                      (lVar25 - local_448.begin.z) * local_448.kstride +
                                      local_448.nstride * uVar21;
                          lVar27 = (iVar16 - local_448.begin.y) * local_448.jstride;
                          lVar31 = local_3c8;
                          do {
                            if (0 < local_368.p
                                    [(local_3e8 - local_368.begin.y) *
                                     CONCAT44(local_368.jstride._4_4_,(int)local_368.jstride) +
                                     (lVar25 - (long)local_3d8) * local_368.kstride +
                                     (lVar31 - local_368.begin.x)]) {
                              lVar26 = lVar31 - local_448.begin.x;
                              dVar37 = 0.0;
                              if (1 < (int)uVar34) {
                                uVar36 = 1;
                                do {
                                  dVar37 = dVar37 + local_3d0[lVar26 + ((iVar16 - local_448.begin.y)
                                                                       + (int)uVar36) *
                                                                       local_448.jstride] *
                                                    local_2e8[uVar36];
                                  uVar36 = uVar36 + 1;
                                } while (uVar35 != uVar36);
                              }
                              local_3d0[lVar27 + lVar26] = dVar37;
                              if (local_3ec == Inhomogeneous) {
                                local_3d0[lVar27 + lVar26] =
                                     local_250.p
                                     [(local_3e8 - local_250.begin.y) * local_250.jstride +
                                      (lVar25 - local_250.begin.z) * local_250.kstride +
                                      local_250.nstride * uVar21 + (lVar31 - local_250.begin.x)] *
                                     local_2e8[0] + dVar37;
                              }
                            }
                            lVar31 = lVar31 + 1;
                          } while (local_3ac != (int)lVar31);
                        }
                        lVar25 = lVar25 + 1;
                        uVar36 = local_318;
                      } while (local_3f0 != (int)lVar25);
                    }
                  }
                  else if (iVar33 == 0x66) {
                    if (iVar10 <= iVar3) {
                      lVar31 = (long)local_368.p +
                               (lVar24 - local_368.begin.z) * local_368.kstride * 4 +
                               (long)(iVar16 - local_368.begin.y) *
                               CONCAT44(local_368.jstride._4_4_,(int)local_368.jstride) * 4 +
                               (long)local_368.begin.x * -4 + local_298;
                      lVar25 = lVar24;
                      do {
                        if (iVar17 <= iVar2) {
                          lVar26 = (lVar25 - local_448.begin.z) * local_448.kstride;
                          lVar27 = 0;
                          do {
                            if (0 < *(int *)(lVar31 + lVar27 * 4)) {
                              *(undefined8 *)
                               ((long)local_448.p +
                               lVar27 * 8 +
                               local_448.jstride * 8 * (long)(iVar16 - local_448.begin.y) +
                               lVar26 * 8 + local_448.nstride * local_408 +
                               (long)local_448.begin.x * -8 + local_280) =
                                   *(undefined8 *)
                                    ((long)local_448.p +
                                    lVar27 * 8 +
                                    (long)(local_268 - local_448.begin.y) * local_448.jstride * 8 +
                                    lVar26 * 8 + local_448.nstride * local_408 +
                                    (long)local_448.begin.x * -8 + local_280);
                            }
                            lVar27 = lVar27 + 1;
                          } while (iVar32 != (int)lVar27);
                        }
                        lVar25 = lVar25 + 1;
                        lVar31 = lVar31 + local_368.kstride * 4;
                      } while (local_3f0 != (int)lVar25);
                    }
                  }
                  else if ((iVar33 == 0x67) && (iVar10 <= iVar3)) {
                    lVar31 = (long)local_368.p +
                             (lVar24 - local_368.begin.z) * local_368.kstride * 4 +
                             (long)(iVar16 - local_368.begin.y) *
                             CONCAT44(local_368.jstride._4_4_,(int)local_368.jstride) * 4 +
                             (long)local_368.begin.x * -4 + local_298;
                    lVar25 = lVar24;
                    do {
                      if (iVar17 <= iVar2) {
                        lVar26 = (lVar25 - local_448.begin.z) * local_448.kstride;
                        lVar27 = 0;
                        do {
                          if (0 < *(int *)(lVar31 + lVar27 * 4)) {
                            *(ulong *)((long)local_448.p +
                                      lVar27 * 8 +
                                      local_448.jstride * 8 * (long)(iVar16 - local_448.begin.y) +
                                      lVar26 * 8 + local_448.nstride * local_408 +
                                      (long)local_448.begin.x * -8 + local_280) =
                                 *(ulong *)((long)local_448.p +
                                           lVar27 * 8 +
                                           (long)(local_268 - local_448.begin.y) *
                                           local_448.jstride * 8 + lVar26 * 8 +
                                           local_448.nstride * local_408 +
                                           (long)local_448.begin.x * -8 + local_280) ^
                                 0x8000000000000000;
                          }
                          lVar27 = lVar27 + 1;
                        } while (iVar32 != (int)lVar27);
                      }
                      lVar25 = lVar25 + 1;
                      lVar31 = lVar31 + local_368.kstride * 4;
                    } while (local_3f0 != (int)lVar25);
                  }
                  if (iVar1 == 0x65) {
                    local_2c0[0] = -dVar38 * dVar13;
                    local_2c0[1] = 0.5;
                    local_2c0[2] = 1.5;
                    local_2c0[3] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar34) {
                      uVar20 = 0;
                      do {
                        uVar36 = 0;
                        dVar37 = dVar7;
                        dVar38 = dVar8;
                        do {
                          if (uVar20 != uVar36) {
                            dVar37 = dVar37 * (-0.5 - local_2c0[uVar36]);
                            dVar38 = dVar38 * (local_2c0[uVar20] - local_2c0[uVar36]);
                          }
                          uVar36 = uVar36 + 1;
                        } while (uVar35 != uVar36);
                        local_2e8[uVar20] = dVar37 / dVar38;
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != uVar35);
                    }
                    uVar20 = local_290;
                    uVar36 = local_318;
                    if (iVar11 <= iVar22) {
                      local_3c0 = (int *)(long)local_3a8.begin.z;
                      local_3e0 = (int *)local_3a8.kstride;
                      local_3d8 = local_3a8.p +
                                  (lVar18 - local_3a8.begin.y) *
                                  CONCAT44(local_3a8.jstride._4_4_,(uint)local_3a8.jstride);
                      local_450 = lVar30;
                      do {
                        if (iVar23 <= iVar4) {
                          local_3d0 = local_448.p +
                                      (local_450 - local_448.begin.z) * local_448.kstride +
                                      local_448.nstride * uVar21;
                          lVar31 = (iVar9 - local_448.begin.y) * local_448.jstride;
                          lVar25 = local_400;
                          do {
                            if (0 < local_3d8[(local_450 - (long)local_3c0) * local_3a8.kstride +
                                              (lVar25 - local_3a8.begin.x)]) {
                              lVar27 = lVar25 - local_448.begin.x;
                              dVar37 = 0.0;
                              if (1 < (int)uVar34) {
                                uVar36 = 1;
                                iVar33 = local_1ec - local_448.begin.y;
                                do {
                                  dVar37 = dVar37 + local_3d0[lVar27 + local_448.jstride * iVar33] *
                                                    local_2e8[uVar36];
                                  uVar36 = uVar36 + 1;
                                  iVar33 = iVar33 + -1;
                                } while (uVar35 != uVar36);
                              }
                              local_3d0[lVar31 + lVar27] = dVar37;
                              if (local_3ec == Inhomogeneous) {
                                local_3d0[lVar31 + lVar27] =
                                     local_1e8.p
                                     [(lVar18 - local_1e8.begin.y) * local_1e8.jstride +
                                      (local_450 - local_1e8.begin.z) * local_1e8.kstride +
                                      local_1e8.nstride * uVar21 + (lVar25 - local_1e8.begin.x)] *
                                     local_2e8[0] + dVar37;
                              }
                            }
                            lVar25 = lVar25 + 1;
                          } while (local_264 != (int)lVar25);
                        }
                        local_450 = local_450 + 1;
                        uVar36 = local_318;
                      } while (local_3f4 != (int)local_450);
                    }
                  }
                  else if (iVar1 == 0x66) {
                    if (iVar11 <= iVar22) {
                      lVar31 = (long)local_3a8.p +
                               (lVar30 - local_3a8.begin.z) * local_3a8.kstride * 4 +
                               (long)(iVar9 - local_3a8.begin.y) *
                               CONCAT44(local_3a8.jstride._4_4_,(uint)local_3a8.jstride) * 4 +
                               (long)local_3a8.begin.x * -4 + local_2a0;
                      lVar25 = lVar30;
                      do {
                        if (iVar23 <= iVar4) {
                          lVar26 = (lVar25 - local_448.begin.z) * local_448.kstride;
                          lVar27 = 0;
                          do {
                            if (0 < *(int *)(lVar31 + lVar27 * 4)) {
                              *(undefined8 *)
                               ((long)local_448.p +
                               lVar27 * 8 +
                               local_448.jstride * 8 * (long)(iVar9 - local_448.begin.y) +
                               lVar26 * 8 + local_448.nstride * local_408 +
                               (long)local_448.begin.x * -8 + local_288) =
                                   *(undefined8 *)
                                    ((long)local_448.p +
                                    lVar27 * 8 +
                                    (long)(~local_448.begin.y + iVar9) * local_448.jstride * 8 +
                                    lVar26 * 8 + local_448.nstride * local_408 +
                                    (long)local_448.begin.x * -8 + local_288);
                            }
                            lVar27 = lVar27 + 1;
                          } while ((int)local_260 != (int)lVar27);
                        }
                        lVar25 = lVar25 + 1;
                        lVar31 = lVar31 + local_3a8.kstride * 4;
                      } while (local_3f4 != (int)lVar25);
                    }
                  }
                  else if ((iVar1 == 0x67) && (iVar11 <= iVar22)) {
                    lVar31 = (long)local_3a8.p +
                             (lVar30 - local_3a8.begin.z) * local_3a8.kstride * 4 +
                             (long)(iVar9 - local_3a8.begin.y) *
                             CONCAT44(local_3a8.jstride._4_4_,(uint)local_3a8.jstride) * 4 +
                             (long)local_3a8.begin.x * -4 + local_2a0;
                    lVar25 = lVar30;
                    do {
                      if (iVar23 <= iVar4) {
                        lVar26 = (lVar25 - local_448.begin.z) * local_448.kstride;
                        lVar27 = 0;
                        do {
                          if (0 < *(int *)(lVar31 + lVar27 * 4)) {
                            *(ulong *)((long)local_448.p +
                                      lVar27 * 8 +
                                      local_448.jstride * 8 * (long)(iVar9 - local_448.begin.y) +
                                      lVar26 * 8 + local_448.nstride * local_408 +
                                      (long)local_448.begin.x * -8 + local_288) =
                                 *(ulong *)((long)local_448.p +
                                           lVar27 * 8 +
                                           (long)(~local_448.begin.y + iVar9) *
                                           local_448.jstride * 8 + lVar26 * 8 +
                                           local_448.nstride * local_408 +
                                           (long)local_448.begin.x * -8 + local_288) ^
                                 0x8000000000000000;
                          }
                          lVar27 = lVar27 + 1;
                        } while ((int)local_260 != (int)lVar27);
                      }
                      lVar25 = lVar25 + 1;
                      lVar31 = lVar31 + local_3a8.kstride * 4;
                    } while (local_3f4 != (int)lVar25);
                  }
                }
                else if ((int)uVar36 == 0) {
                  if (iVar33 == 0x65) {
                    local_2c0[0] = -dVar37 * dVar14;
                    local_2c0[1] = 0.5;
                    local_2c0[2] = 1.5;
                    local_2c0[3] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar34) {
                      uVar20 = 0;
                      do {
                        uVar36 = 0;
                        dVar37 = dVar7;
                        dVar39 = dVar8;
                        do {
                          if (uVar20 != uVar36) {
                            dVar37 = dVar37 * (-0.5 - local_2c0[uVar36]);
                            dVar39 = dVar39 * (local_2c0[uVar20] - local_2c0[uVar36]);
                          }
                          uVar36 = uVar36 + 1;
                        } while (uVar35 != uVar36);
                        local_2e8[uVar20] = dVar37 / dVar39;
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != uVar35);
                    }
                    uVar20 = local_290;
                    uVar36 = local_318;
                    if (iVar10 <= iVar3) {
                      local_208 = (int *)local_368.kstride;
                      local_f0 = (long)local_368.begin.z;
                      local_3e0 = local_368.p + (local_3c8 - local_368.begin.x);
                      lVar25 = lVar24;
                      do {
                        if (iVar16 <= iVar5) {
                          local_3d0 = local_448.p +
                                      (lVar25 - local_448.begin.z) * local_448.kstride +
                                      local_448.nstride * uVar21;
                          iVar33 = iVar17 - local_448.begin.x;
                          local_3d8 = (int *)local_250.jstride;
                          lVar31 = local_3e8;
                          do {
                            if (0 < local_3e0[(lVar25 - local_368.begin.z) * local_368.kstride +
                                              (lVar31 - local_368.begin.y) *
                                              CONCAT44(local_368.jstride._4_4_,
                                                       (int)local_368.jstride)]) {
                              lVar27 = (lVar31 - local_448.begin.y) * local_448.jstride;
                              dVar37 = 0.0;
                              if (1 < (int)uVar34) {
                                uVar36 = 1;
                                do {
                                  dVar37 = dVar37 + local_3d0[lVar27 + (iVar33 + (int)uVar36)] *
                                                    local_2e8[uVar36];
                                  uVar36 = uVar36 + 1;
                                } while (uVar35 != uVar36);
                              }
                              local_3d0[iVar33 + lVar27] = dVar37;
                              if (local_3ec == Inhomogeneous) {
                                local_3d0[iVar33 + lVar27] =
                                     local_250.p
                                     [(local_3c8 - local_250.begin.x) +
                                      (lVar25 - local_250.begin.z) * local_250.kstride +
                                      local_250.nstride * uVar21 +
                                      (lVar31 - local_250.begin.y) * local_250.jstride] *
                                     local_2e8[0] + dVar37;
                              }
                            }
                            lVar31 = lVar31 + 1;
                          } while (local_3b0 != (int)lVar31);
                        }
                        lVar25 = lVar25 + 1;
                        uVar36 = local_318;
                      } while (local_3f0 != (int)lVar25);
                    }
                  }
                  else if (iVar33 == 0x66) {
                    if (iVar10 <= iVar3) {
                      piVar19 = (int *)((long)local_368.p +
                                       (lVar24 - local_368.begin.z) * local_368.kstride * 4 +
                                       (local_3e8 - local_368.begin.y) *
                                       CONCAT44(local_368.jstride._4_4_,(int)local_368.jstride) * 4
                                       + (long)local_368.begin.x * -4 + local_298);
                      lVar25 = lVar24;
                      do {
                        if (iVar16 <= iVar5) {
                          lVar31 = local_448.nstride * local_408 +
                                   (local_3e8 - local_448.begin.y) * local_448.jstride * 8 +
                                   (lVar25 - local_448.begin.z) * local_448.kstride * 8 +
                                   (long)local_448.p;
                          piVar29 = piVar19;
                          iVar33 = local_274;
                          do {
                            if (0 < *piVar29) {
                              *(undefined8 *)(lVar31 + local_280 + (long)local_448.begin.x * -8) =
                                   *(undefined8 *)
                                    (lVar31 + (long)(local_26c - local_448.begin.x) * 8);
                            }
                            lVar31 = lVar31 + local_448.jstride * 8;
                            piVar29 = piVar29 + CONCAT44(local_368.jstride._4_4_,
                                                         (int)local_368.jstride);
                            iVar33 = iVar33 + -1;
                          } while (iVar33 != 0);
                        }
                        lVar25 = lVar25 + 1;
                        piVar19 = piVar19 + local_368.kstride;
                      } while (local_3f0 != (int)lVar25);
                    }
                  }
                  else if ((iVar33 == 0x67) && (iVar10 <= iVar3)) {
                    piVar19 = (int *)((long)local_368.p +
                                     (lVar24 - local_368.begin.z) * local_368.kstride * 4 +
                                     (local_3e8 - local_368.begin.y) *
                                     CONCAT44(local_368.jstride._4_4_,(int)local_368.jstride) * 4 +
                                     (long)local_368.begin.x * -4 + local_298);
                    lVar25 = lVar24;
                    do {
                      if (iVar16 <= iVar5) {
                        lVar31 = local_448.nstride * local_408 +
                                 (local_3e8 - local_448.begin.y) * local_448.jstride * 8 +
                                 (lVar25 - local_448.begin.z) * local_448.kstride * 8 +
                                 (long)local_448.p;
                        piVar29 = piVar19;
                        iVar33 = local_274;
                        do {
                          if (0 < *piVar29) {
                            *(ulong *)(lVar31 + local_280 + (long)local_448.begin.x * -8) =
                                 *(ulong *)(lVar31 + (long)(local_26c - local_448.begin.x) * 8) ^
                                 0x8000000000000000;
                          }
                          lVar31 = lVar31 + local_448.jstride * 8;
                          piVar29 = piVar29 + CONCAT44(local_368.jstride._4_4_,
                                                       (int)local_368.jstride);
                          iVar33 = iVar33 + -1;
                        } while (iVar33 != 0);
                      }
                      lVar25 = lVar25 + 1;
                      piVar19 = piVar19 + local_368.kstride;
                    } while (local_3f0 != (int)lVar25);
                  }
                  if (iVar1 == 0x65) {
                    local_2c0[0] = -dVar38 * dVar14;
                    local_2c0[1] = 0.5;
                    local_2c0[2] = 1.5;
                    local_2c0[3] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar34) {
                      uVar20 = 0;
                      do {
                        uVar36 = 0;
                        dVar37 = dVar7;
                        dVar38 = dVar8;
                        do {
                          if (uVar20 != uVar36) {
                            dVar37 = dVar37 * (-0.5 - local_2c0[uVar36]);
                            dVar38 = dVar38 * (local_2c0[uVar20] - local_2c0[uVar36]);
                          }
                          uVar36 = uVar36 + 1;
                        } while (uVar35 != uVar36);
                        local_2e8[uVar20] = dVar37 / dVar38;
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != uVar35);
                    }
                    uVar20 = local_290;
                    uVar36 = local_318;
                    if (iVar11 <= iVar22) {
                      local_3e0 = (int *)local_3a8.kstride;
                      local_208 = (int *)(long)local_3a8.begin.z;
                      local_3c0 = local_3a8.p + (local_400 - local_3a8.begin.x);
                      lVar25 = lVar30;
                      do {
                        if (iVar9 <= iVar6) {
                          local_3d0 = local_448.p +
                                      (lVar25 - local_448.begin.z) * local_448.kstride +
                                      local_448.nstride * uVar21;
                          local_3d8 = (int *)local_1e8.jstride;
                          lVar31 = lVar18;
                          do {
                            if (0 < local_3c0[(lVar25 - local_3a8.begin.z) * local_3a8.kstride +
                                              (lVar31 - local_3a8.begin.y) *
                                              CONCAT44(local_3a8.jstride._4_4_,
                                                       (uint)local_3a8.jstride)]) {
                              lVar27 = (lVar31 - local_448.begin.y) * local_448.jstride;
                              dVar37 = 0.0;
                              if (1 < (int)uVar34) {
                                uVar36 = 1;
                                iVar33 = local_1f0 - local_448.begin.x;
                                do {
                                  dVar37 = dVar37 + local_3d0[lVar27 + iVar33] * local_2e8[uVar36];
                                  uVar36 = uVar36 + 1;
                                  iVar33 = iVar33 + -1;
                                } while (uVar35 != uVar36);
                              }
                              local_3d0[(iVar23 - local_448.begin.x) + lVar27] = dVar37;
                              if (local_3ec == Inhomogeneous) {
                                local_3d0[(iVar23 - local_448.begin.x) + lVar27] =
                                     local_1e8.p
                                     [(local_400 - local_1e8.begin.x) +
                                      (lVar25 - local_1e8.begin.z) * local_1e8.kstride +
                                      local_1e8.nstride * uVar21 +
                                      (lVar31 - local_1e8.begin.y) * local_1e8.jstride] *
                                     local_2e8[0] + dVar37;
                              }
                            }
                            lVar31 = lVar31 + 1;
                          } while (local_3b4 != (int)lVar31);
                        }
                        lVar25 = lVar25 + 1;
                        uVar36 = local_318;
                      } while (local_3f4 != (int)lVar25);
                    }
                  }
                  else if (iVar1 == 0x66) {
                    if (iVar11 <= iVar22) {
                      piVar19 = (int *)((long)local_3a8.p +
                                       (lVar30 - local_3a8.begin.z) * local_3a8.kstride * 4 +
                                       (lVar18 - local_3a8.begin.y) *
                                       CONCAT44(local_3a8.jstride._4_4_,(uint)local_3a8.jstride) * 4
                                       + (long)local_3a8.begin.x * -4 + local_2a0);
                      lVar25 = lVar30;
                      do {
                        if (iVar9 <= iVar6) {
                          lVar31 = local_448.nstride * local_408 +
                                   (lVar18 - local_448.begin.y) * local_448.jstride * 8 +
                                   (lVar25 - local_448.begin.z) * local_448.kstride * 8 +
                                   (long)local_448.p;
                          piVar29 = piVar19;
                          iVar33 = local_278;
                          do {
                            if (0 < *piVar29) {
                              *(undefined8 *)(lVar31 + local_288 + (long)local_448.begin.x * -8) =
                                   *(undefined8 *)(lVar31 + (long)(~local_448.begin.x + iVar23) * 8)
                              ;
                            }
                            lVar31 = lVar31 + local_448.jstride * 8;
                            piVar29 = piVar29 + CONCAT44(local_3a8.jstride._4_4_,
                                                         (uint)local_3a8.jstride);
                            iVar33 = iVar33 + -1;
                          } while (iVar33 != 0);
                        }
                        lVar25 = lVar25 + 1;
                        piVar19 = piVar19 + local_3a8.kstride;
                      } while (local_3f4 != (int)lVar25);
                    }
                  }
                  else if ((iVar1 == 0x67) && (iVar11 <= iVar22)) {
                    piVar19 = (int *)((long)local_3a8.p +
                                     (lVar30 - local_3a8.begin.z) * local_3a8.kstride * 4 +
                                     (lVar18 - local_3a8.begin.y) *
                                     CONCAT44(local_3a8.jstride._4_4_,(uint)local_3a8.jstride) * 4 +
                                     (long)local_3a8.begin.x * -4 + local_2a0);
                    lVar25 = lVar30;
                    do {
                      if (iVar9 <= iVar6) {
                        lVar31 = local_448.nstride * local_408 +
                                 (lVar18 - local_448.begin.y) * local_448.jstride * 8 +
                                 (lVar25 - local_448.begin.z) * local_448.kstride * 8 +
                                 (long)local_448.p;
                        piVar29 = piVar19;
                        iVar33 = local_278;
                        do {
                          if (0 < *piVar29) {
                            *(ulong *)(lVar31 + local_288 + (long)local_448.begin.x * -8) =
                                 *(ulong *)(lVar31 + (long)(~local_448.begin.x + iVar23) * 8) ^
                                 0x8000000000000000;
                          }
                          lVar31 = lVar31 + local_448.jstride * 8;
                          piVar29 = piVar29 + CONCAT44(local_3a8.jstride._4_4_,
                                                       (uint)local_3a8.jstride);
                          iVar33 = iVar33 + -1;
                        } while (iVar33 != 0);
                      }
                      lVar25 = lVar25 + 1;
                      piVar19 = piVar19 + local_3a8.kstride;
                    } while (local_3f4 != (int)lVar25);
                  }
                }
                else {
                  if (iVar33 == 0x65) {
                    local_2c0[0] = -dVar37 * dVar12;
                    local_2c0[1] = 0.5;
                    local_2c0[2] = 1.5;
                    local_2c0[3] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar34) {
                      uVar20 = 0;
                      do {
                        uVar36 = 0;
                        dVar37 = dVar7;
                        dVar39 = dVar8;
                        do {
                          if (uVar20 != uVar36) {
                            dVar37 = dVar37 * (-0.5 - local_2c0[uVar36]);
                            dVar39 = dVar39 * (local_2c0[uVar20] - local_2c0[uVar36]);
                          }
                          uVar36 = uVar36 + 1;
                        } while (uVar35 != uVar36);
                        local_2e8[uVar20] = dVar37 / dVar39;
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != uVar35);
                    }
                    uVar20 = local_290;
                    uVar36 = local_318;
                    if (iVar16 <= iVar5) {
                      local_3d8 = (int *)CONCAT44(local_368.jstride._4_4_,(int)local_368.jstride);
                      local_3e0 = local_368.p + (lVar24 - local_368.begin.z) * local_368.kstride;
                      lVar25 = local_3e8;
                      do {
                        if (iVar17 <= iVar2) {
                          local_3d0 = local_448.p +
                                      (lVar25 - local_448.begin.y) * local_448.jstride +
                                      local_448.nstride * uVar21;
                          lVar27 = (iVar10 - local_448.begin.z) * local_448.kstride;
                          lVar31 = local_3c8;
                          do {
                            if (0 < local_3e0[(lVar25 - local_368.begin.y) * (long)local_3d8 +
                                              (lVar31 - local_368.begin.x)]) {
                              lVar26 = lVar31 - local_448.begin.x;
                              dVar37 = 0.0;
                              if (1 < (int)uVar34) {
                                uVar36 = 1;
                                do {
                                  dVar37 = dVar37 + local_3d0[lVar26 + ((iVar10 - local_448.begin.z)
                                                                       + (int)uVar36) *
                                                                       local_448.kstride] *
                                                    local_2e8[uVar36];
                                  uVar36 = uVar36 + 1;
                                } while (uVar35 != uVar36);
                              }
                              local_3d0[lVar27 + lVar26] = dVar37;
                              if (local_3ec == Inhomogeneous) {
                                local_3d0[lVar27 + lVar26] =
                                     local_250.p
                                     [(lVar25 - local_250.begin.y) * local_250.jstride +
                                      (lVar24 - local_250.begin.z) * local_250.kstride +
                                      local_250.nstride * uVar21 + (lVar31 - local_250.begin.x)] *
                                     local_2e8[0] + dVar37;
                              }
                            }
                            lVar31 = lVar31 + 1;
                          } while (local_3ac != (int)lVar31);
                        }
                        lVar25 = lVar25 + 1;
                        uVar36 = local_318;
                      } while (local_3b0 != (int)lVar25);
                    }
                  }
                  else if (iVar33 == 0x66) {
                    if (iVar16 <= iVar5) {
                      lVar27 = CONCAT44(local_368.jstride._4_4_,(int)local_368.jstride) * 4;
                      lVar31 = (long)local_368.p +
                               (local_3e8 - local_368.begin.y) * lVar27 +
                               (iVar10 - local_368.begin.z) * local_368.kstride * 4 +
                               (long)local_368.begin.x * -4 + local_298;
                      lVar25 = local_3e8;
                      do {
                        if (iVar17 <= iVar2) {
                          lVar28 = (lVar25 - local_448.begin.y) * local_448.jstride;
                          lVar26 = 0;
                          do {
                            if (0 < *(int *)(lVar31 + lVar26 * 4)) {
                              *(undefined8 *)
                               ((long)local_448.p +
                               lVar26 * 8 +
                               (long)(iVar10 - local_448.begin.z) * local_448.kstride * 8 +
                               lVar28 * 8 + local_448.nstride * local_408 +
                               (long)local_448.begin.x * -8 + local_280) =
                                   *(undefined8 *)
                                    ((long)local_448.p +
                                    lVar26 * 8 +
                                    local_448.kstride * 8 * (long)(local_270 - local_448.begin.z) +
                                    lVar28 * 8 + local_448.nstride * local_408 +
                                    (long)local_448.begin.x * -8 + local_280);
                            }
                            lVar26 = lVar26 + 1;
                          } while (iVar32 != (int)lVar26);
                        }
                        lVar25 = lVar25 + 1;
                        lVar31 = lVar31 + lVar27;
                      } while (local_3b0 != (int)lVar25);
                    }
                  }
                  else if ((iVar33 == 0x67) && (iVar16 <= iVar5)) {
                    lVar27 = CONCAT44(local_368.jstride._4_4_,(int)local_368.jstride) * 4;
                    lVar31 = (long)local_368.p +
                             (local_3e8 - local_368.begin.y) * lVar27 +
                             (iVar10 - local_368.begin.z) * local_368.kstride * 4 +
                             (long)local_368.begin.x * -4 + local_298;
                    lVar25 = local_3e8;
                    do {
                      if (iVar17 <= iVar2) {
                        lVar28 = (lVar25 - local_448.begin.y) * local_448.jstride;
                        lVar26 = 0;
                        do {
                          if (0 < *(int *)(lVar31 + lVar26 * 4)) {
                            *(ulong *)((long)local_448.p +
                                      lVar26 * 8 +
                                      (long)(iVar10 - local_448.begin.z) * local_448.kstride * 8 +
                                      lVar28 * 8 + local_448.nstride * local_408 +
                                      (long)local_448.begin.x * -8 + local_280) =
                                 *(ulong *)((long)local_448.p +
                                           lVar26 * 8 +
                                           local_448.kstride * 8 *
                                           (long)(local_270 - local_448.begin.z) + lVar28 * 8 +
                                           local_448.nstride * local_408 +
                                           (long)local_448.begin.x * -8 + local_280) ^
                                 0x8000000000000000;
                          }
                          lVar26 = lVar26 + 1;
                        } while (iVar32 != (int)lVar26);
                      }
                      lVar25 = lVar25 + 1;
                      lVar31 = lVar31 + lVar27;
                    } while (local_3b0 != (int)lVar25);
                  }
                  if (iVar1 == 0x65) {
                    local_2c0[0] = -dVar38 * dVar12;
                    local_2c0[1] = 0.5;
                    local_2c0[2] = 1.5;
                    local_2c0[3] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar34) {
                      uVar20 = 0;
                      do {
                        uVar36 = 0;
                        dVar37 = dVar7;
                        dVar38 = dVar8;
                        do {
                          if (uVar20 != uVar36) {
                            dVar37 = dVar37 * (-0.5 - local_2c0[uVar36]);
                            dVar38 = dVar38 * (local_2c0[uVar20] - local_2c0[uVar36]);
                          }
                          uVar36 = uVar36 + 1;
                        } while (uVar35 != uVar36);
                        local_2e8[uVar20] = dVar37 / dVar38;
                        uVar20 = uVar20 + 1;
                      } while (uVar20 != uVar35);
                    }
                    uVar20 = local_290;
                    uVar36 = local_318;
                    if (iVar9 <= iVar6) {
                      local_3d8 = (int *)(long)local_3a8.begin.y;
                      local_3c0 = (int *)CONCAT44(local_3a8.jstride._4_4_,(uint)local_3a8.jstride);
                      local_3e0 = local_3a8.p + (lVar30 - local_3a8.begin.z) * local_3a8.kstride;
                      local_450 = lVar18;
                      do {
                        if (iVar23 <= iVar4) {
                          local_3d0 = local_448.p +
                                      (local_450 - local_448.begin.y) * local_448.jstride +
                                      local_448.nstride * uVar21;
                          lVar31 = (iVar11 - local_448.begin.z) * local_448.kstride;
                          lVar25 = local_400;
                          do {
                            if (0 < local_3e0[(local_450 - (long)local_3d8) * (long)local_3c0 +
                                              (lVar25 - local_3a8.begin.x)]) {
                              lVar27 = lVar25 - local_448.begin.x;
                              dVar37 = 0.0;
                              if (1 < (int)uVar34) {
                                uVar36 = 1;
                                iVar33 = local_1f4 - local_448.begin.z;
                                do {
                                  dVar37 = dVar37 + local_3d0[lVar27 + local_448.kstride * iVar33] *
                                                    local_2e8[uVar36];
                                  uVar36 = uVar36 + 1;
                                  iVar33 = iVar33 + -1;
                                } while (uVar35 != uVar36);
                              }
                              local_3d0[lVar31 + lVar27] = dVar37;
                              if (local_3ec == Inhomogeneous) {
                                local_3d0[lVar31 + lVar27] =
                                     local_1e8.p
                                     [(local_450 - local_1e8.begin.y) * local_1e8.jstride +
                                      (lVar30 - local_1e8.begin.z) * local_1e8.kstride +
                                      local_1e8.nstride * uVar21 + (lVar25 - local_1e8.begin.x)] *
                                     local_2e8[0] + dVar37;
                              }
                            }
                            lVar25 = lVar25 + 1;
                          } while (local_264 != (int)lVar25);
                        }
                        local_450 = local_450 + 1;
                        uVar36 = local_318;
                      } while (local_3b4 != (int)local_450);
                    }
                  }
                  else if (iVar1 == 0x66) {
                    if (iVar9 <= iVar6) {
                      lVar27 = CONCAT44(local_3a8.jstride._4_4_,(uint)local_3a8.jstride) * 4;
                      lVar31 = (long)local_3a8.p +
                               (lVar18 - local_3a8.begin.y) * lVar27 +
                               (iVar11 - local_3a8.begin.z) * local_3a8.kstride * 4 +
                               (long)local_3a8.begin.x * -4 + local_2a0;
                      lVar25 = lVar18;
                      do {
                        if (iVar23 <= iVar4) {
                          lVar28 = (lVar25 - local_448.begin.y) * local_448.jstride;
                          lVar26 = 0;
                          do {
                            if (0 < *(int *)(lVar31 + lVar26 * 4)) {
                              *(undefined8 *)
                               ((long)local_448.p +
                               lVar26 * 8 +
                               (long)(iVar11 - local_448.begin.z) * local_448.kstride * 8 +
                               lVar28 * 8 + local_448.nstride * local_408 +
                               (long)local_448.begin.x * -8 + local_288) =
                                   *(undefined8 *)
                                    ((long)local_448.p +
                                    lVar26 * 8 +
                                    local_448.kstride * 8 * (long)(~local_448.begin.z + iVar11) +
                                    lVar28 * 8 + local_448.nstride * local_408 +
                                    (long)local_448.begin.x * -8 + local_288);
                            }
                            lVar26 = lVar26 + 1;
                          } while ((int)local_260 != (int)lVar26);
                        }
                        lVar25 = lVar25 + 1;
                        lVar31 = lVar31 + lVar27;
                      } while (local_3b4 != (int)lVar25);
                    }
                  }
                  else if ((iVar1 == 0x67) && (iVar9 <= iVar6)) {
                    lVar27 = CONCAT44(local_3a8.jstride._4_4_,(uint)local_3a8.jstride) * 4;
                    lVar31 = (long)local_3a8.p +
                             (lVar18 - local_3a8.begin.y) * lVar27 +
                             (iVar11 - local_3a8.begin.z) * local_3a8.kstride * 4 +
                             (long)local_3a8.begin.x * -4 + local_2a0;
                    lVar25 = lVar18;
                    do {
                      if (iVar23 <= iVar4) {
                        lVar28 = (lVar25 - local_448.begin.y) * local_448.jstride;
                        lVar26 = 0;
                        do {
                          if (0 < *(int *)(lVar31 + lVar26 * 4)) {
                            *(ulong *)((long)local_448.p +
                                      lVar26 * 8 +
                                      (long)(iVar11 - local_448.begin.z) * local_448.kstride * 8 +
                                      lVar28 * 8 + local_448.nstride * local_408 +
                                      (long)local_448.begin.x * -8 + local_288) =
                                 *(ulong *)((long)local_448.p +
                                           lVar26 * 8 +
                                           local_448.kstride * 8 *
                                           (long)(~local_448.begin.z + iVar11) + lVar28 * 8 +
                                           local_448.nstride * local_408 +
                                           (long)local_448.begin.x * -8 + local_288) ^
                                 0x8000000000000000;
                          }
                          lVar26 = lVar26 + 1;
                        } while ((int)local_260 != (int)lVar26);
                      }
                      lVar25 = lVar25 + 1;
                      lVar31 = lVar31 + lVar27;
                    } while (local_3b4 != (int)lVar25);
                  }
                }
                uVar21 = uVar21 + 1;
                local_408 = local_408 + 8;
              } while (uVar21 != uVar20);
            }
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != 3);
        MFIter::operator++(&local_d8);
      } while (local_d8.currentIndex < local_d8.endIndex);
    }
    MFIter::~MFIter(&local_d8);
  }
  else {
    Abort_host("amrex_mllinop_apply_bc not available when BL_NO_FORT=TRUE");
  }
  local_78._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
  BaseFab<double>::clear(&local_78);
  return;
}

Assistant:

void
MLCellLinOp::applyBC (int amrlev, int mglev, MultiFab& in, BCMode bc_mode, StateMode,
                      const MLMGBndry* bndry, bool skip_fillboundary) const
{
    BL_PROFILE("MLCellLinOp::applyBC()");
    // No coarsened boundary values, cannot apply inhomog at mglev>0.
    BL_ASSERT(mglev == 0 || bc_mode == BCMode::Homogeneous);
    BL_ASSERT(bndry != nullptr || bc_mode == BCMode::Homogeneous);

    const int ncomp = getNComp();
    const int cross = isCrossStencil();
    const int tensorop = isTensorOp();
    if (!skip_fillboundary) {
        in.FillBoundary(0, ncomp, m_geom[amrlev][mglev].periodicity(),cross);
    }

    int flagbc = bc_mode == BCMode::Inhomogeneous;
    const int imaxorder = maxorder;

    const Real* dxinv = m_geom[amrlev][mglev].InvCellSize();
    const Real dxi = dxinv[0];
    const Real dyi = (AMREX_SPACEDIM >= 2) ? dxinv[1] : Real(1.0);
    const Real dzi = (AMREX_SPACEDIM == 3) ? dxinv[2] : Real(1.0);

    const auto& maskvals = m_maskvals[amrlev][mglev];
    const auto& bcondloc = *m_bcondloc[amrlev][mglev];

    FArrayBox foofab(Box::TheUnitBox(),ncomp);
    const auto& foo = foofab.const_array();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(cross || tensorop || Gpu::notInLaunchRegion(),
                                     "non-cross stencil not support for gpu");

    const int hidden_direction = hiddenDirection();

#ifdef AMREX_USE_GPU
    if ((cross || tensorop) && Gpu::inLaunchRegion())
    {
        Vector<ABCTag> tags;
        tags.reserve(in.local_size()*AMREX_SPACEDIM*ncomp);

        for (MFIter mfi(in); mfi.isValid(); ++mfi) {
            const Box& vbx = mfi.validbox();
            const auto& iofab = in.array(mfi);
            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (idim != hidden_direction) {
                    const Orientation olo(idim,Orientation::low);
                    const Orientation ohi(idim,Orientation::high);
                    const auto& bvlo = (bndry != nullptr) ?
                        bndry->bndryValues(olo).const_array(mfi) : foo;
                    const auto& bvhi = (bndry != nullptr) ?
                        bndry->bndryValues(ohi).const_array(mfi) : foo;
                    for (int icomp = 0; icomp < ncomp; ++icomp) {
                        tags.emplace_back(ABCTag{iofab, bvlo, bvhi,
                                                 maskvals[olo].const_array(mfi),
                                                 maskvals[ohi].const_array(mfi),
                                                 bdlv[icomp][olo], bdlv[icomp][ohi],
                                                 amrex::adjCell(vbx,olo),
                                                 bdcv[icomp][olo], bdcv[icomp][ohi],
                                                 vbx.length(idim), icomp, idim});
                    }
                }
            }
        }

        ParallelFor(tags,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, ABCTag const& tag) noexcept
        {
            if (tag.dir == 0)
            {
                mllinop_apply_bc_x(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dxi, flagbc, tag.comp);
                mllinop_apply_bc_x(1, i+tag.blen+1, j, k, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dxi, flagbc, tag.comp);
            }
#if (AMREX_SPACEDIM > 1)
            else
#if (AMREX_SPACEDIM > 2)
            if (tag.dir == 1)
#endif
            {
                mllinop_apply_bc_y(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dyi, flagbc, tag.comp);
                mllinop_apply_bc_y(1, i, j+tag.blen+1, k, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dyi, flagbc, tag.comp);
            }
#if (AMREX_SPACEDIM > 2)
            else {
                mllinop_apply_bc_z(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dzi, flagbc, tag.comp);
                mllinop_apply_bc_z(1, i, j, k+tag.blen+1, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dzi, flagbc, tag.comp);
            }
#endif
#endif
        });
    } else
#endif
    if (cross || tensorop)
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(in, mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx   = mfi.validbox();
            const auto& iofab = in.array(mfi);

            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                if (hidden_direction == idim) continue;
                const Orientation olo(idim,Orientation::low);
                const Orientation ohi(idim,Orientation::high);
                const Box blo = amrex::adjCellLo(vbx, idim);
                const Box bhi = amrex::adjCellHi(vbx, idim);
                const int blen = vbx.length(idim);
                const auto& mlo = maskvals[olo].array(mfi);
                const auto& mhi = maskvals[ohi].array(mfi);
                const auto& bvlo = (bndry != nullptr) ? bndry->bndryValues(olo).const_array(mfi) : foo;
                const auto& bvhi = (bndry != nullptr) ? bndry->bndryValues(ohi).const_array(mfi) : foo;
                for (int icomp = 0; icomp < ncomp; ++icomp) {
                    const BoundCond bctlo = bdcv[icomp][olo];
                    const BoundCond bcthi = bdcv[icomp][ohi];
                    const Real bcllo = bdlv[icomp][olo];
                    const Real bclhi = bdlv[icomp][ohi];
                    if (idim == 0) {
                        mllinop_apply_bc_x(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dxi, flagbc, icomp);
                        mllinop_apply_bc_x(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dxi, flagbc, icomp);
                    } else if (idim == 1) {
                        mllinop_apply_bc_y(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dyi, flagbc, icomp);
                        mllinop_apply_bc_y(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dyi, flagbc, icomp);
                    } else {
                        mllinop_apply_bc_z(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dzi, flagbc, icomp);
                        mllinop_apply_bc_z(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dzi, flagbc, icomp);
                    }
                }
            }
        }
    }
    else
    {
#ifdef BL_NO_FORT
        amrex::Abort("amrex_mllinop_apply_bc not available when BL_NO_FORT=TRUE");
#else
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(in, mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx   = mfi.validbox();

            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            const RealTuple & bdl = bdlv[0];
            const BCTuple   & bdc = bdcv[0];

            for (OrientationIter oitr; oitr; ++oitr)
            {
                const Orientation ori = oitr();

                int  cdr = ori;
                Real bcl = bdl[ori];
                int  bct = bdc[ori];

                const FArrayBox& fsfab = (bndry != nullptr) ? bndry->bndryValues(ori)[mfi] : foofab;

                const Mask& m = maskvals[ori][mfi];

                amrex_mllinop_apply_bc(BL_TO_FORTRAN_BOX(vbx),
                                       BL_TO_FORTRAN_ANYD(in[mfi]),
                                       BL_TO_FORTRAN_ANYD(m),
                                       cdr, bct, bcl,
                                       BL_TO_FORTRAN_ANYD(fsfab),
                                       maxorder, dxinv, flagbc, ncomp, cross);
            }
        }
#endif
    }
}